

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::WriteAllBoards(BasePort *this)

{
  BoardIO *pBVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ostream *poVar7;
  bool bVar8;
  ulong uVar9;
  uchar *puVar10;
  uint board;
  ulong uVar11;
  allocator<char> local_55;
  uint local_54;
  quadlet_t ctrl;
  
  iVar4 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar4 == '\0') {
    poVar7 = std::operator<<(this->outStr,"BasePort::WriteAllBoards: port not initialized");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    if (this->Protocol_ - PROTOCOL_SEQ_R_BC_W < 2) {
      iVar4 = (*this->_vptr_BasePort[0x22])(this);
      return SUB41(iVar4,0);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&ctrl,"WriteAllBoards",&local_55);
    iVar4 = (*this->_vptr_BasePort[0x1b])(this,(string *)&ctrl,(ulong)this->autoReScan);
    std::__cxx11::string::~string((string *)&ctrl);
    if ((char)iVar4 != '\0') {
      this->rtWrite = true;
      uVar9 = CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
      uVar11 = 0;
      bVar8 = true;
      do {
        if (this->max_board <= uVar11) {
          if ((uVar9 & 1) != 0) {
            (*this->_vptr_BasePort[9])(this);
          }
          if (this->rtWrite != false) {
            return bVar8;
          }
          poVar7 = std::operator<<(this->outStr,"BasePort::WriteAllBoards: rtWrite is false");
          std::endl<char,std::char_traits<char>>(poVar7);
          return bVar8;
        }
        if (this->BoardList[uVar11] != (BoardIO *)0x0) {
          puVar10 = this->WriteBufferBroadcast;
          uVar5 = (*this->_vptr_BasePort[0x17])(this);
          uVar6 = (*this->_vptr_BasePort[0x14])(this,2);
          puVar10 = puVar10 + (ulong)uVar6 + (ulong)uVar5;
          uVar5 = (*this->BoardList[uVar11]->_vptr_BoardIO[3])();
          pBVar1 = this->BoardList[uVar11];
          if (this->FirmwareVersion[uVar11] < 7) {
            local_54 = (uint)uVar9;
            uVar6 = (uVar5 >> 2) - 1;
            (*pBVar1->_vptr_BoardIO[4])(pBVar1,puVar10,0,(ulong)uVar6,1);
            iVar4 = (*this->_vptr_BasePort[0x27])(this,uVar11 & 0xff,0,puVar10,(ulong)(uVar5 - 4));
            bVar2 = (byte)iVar4;
            bVar8 = (bool)(bVar8 & bVar2);
            (*this->BoardList[uVar11]->_vptr_BoardIO[4])
                      (this->BoardList[uVar11],&ctrl,(ulong)uVar6,1,0);
            if (ctrl == 0) {
              bVar3 = 1;
              if (bVar2 != 0) {
                uVar9 = 0;
                bVar3 = 1;
                goto LAB_0010b5a7;
              }
              uVar9 = (ulong)local_54;
LAB_0010b5b6:
              iVar4 = (*this->_vptr_BasePort[0x25])(this,uVar11 & 0xff);
              uVar9 = CONCAT71((int7)(uVar9 >> 8),(byte)uVar9 & ((byte)iVar4 ^ 1));
            }
            else {
              iVar4 = (*this->_vptr_BasePort[0x24])(this,uVar11 & 0xff,0);
              bVar3 = (byte)iVar4;
              uVar9 = (ulong)CONCAT31((int3)(local_54 >> 8),
                                      (byte)local_54 & (bVar3 ^ 1) & (bVar2 ^ 1));
              bVar8 = (bool)(bVar8 & bVar3);
              if ((bVar2 == 0) && ((bVar3 ^ 1) != 0)) goto LAB_0010b5b6;
LAB_0010b5a7:
              iVar4 = (*this->BoardList[uVar11]->_vptr_BoardIO[6])();
              if ((char)iVar4 == '\0') goto LAB_0010b5b6;
            }
            pBVar1 = this->BoardList[uVar11];
            pBVar1->writeValid = (bool)(bVar2 & bVar3);
            if ((bool)(bVar2 & bVar3) == false) {
              pBVar1->numWriteErrors = pBVar1->numWriteErrors + 1;
            }
            (*pBVar1->_vptr_BoardIO[5])();
          }
          else {
            (*pBVar1->_vptr_BoardIO[4])(pBVar1,puVar10,0,(ulong)(uVar5 >> 2),1);
            iVar4 = (*this->_vptr_BasePort[0x27])(this,uVar11 & 0xff,0,puVar10,(ulong)uVar5);
            pBVar1 = this->BoardList[uVar11];
            pBVar1->writeValid = SUB41(iVar4,0);
            if (SUB41(iVar4,0) == false) {
              pBVar1->numWriteErrors = pBVar1->numWriteErrors + 1;
              (*pBVar1->_vptr_BoardIO[5])();
              bVar8 = false;
            }
            else {
              (*pBVar1->_vptr_BoardIO[5])();
              (*this->BoardList[uVar11]->_vptr_BoardIO[7])();
              uVar9 = 0;
            }
          }
        }
        uVar11 = uVar11 + 1;
      } while( true );
    }
  }
  (*this->_vptr_BasePort[9])(this);
  return false;
}

Assistant:

bool BasePort::WriteAllBoards(void)
{
    if (!IsOK()) {
        outStr << "BasePort::WriteAllBoards: port not initialized" << std::endl;
        OnNoneWritten();
        return false;
    }

    if ((Protocol_ == BasePort::PROTOCOL_SEQ_R_BC_W) || (Protocol_ == BasePort::PROTOCOL_BC_QRW)) {
        return WriteAllBoardsBroadcast();
    }

    if (!CheckFwBusGeneration("WriteAllBoards", autoReScan)) {
        OnNoneWritten();
        return false;
    }

    rtWrite = true;   // for debugging
    bool allOK = true;
    bool noneWritten = true;
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            quadlet_t *buf = reinterpret_cast<quadlet_t *>(WriteBufferBroadcast + GetWriteQuadAlign() + GetPrefixOffset(WR_FW_BDATA));
            unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
            unsigned int numQuads = numBytes/sizeof(quadlet_t);
            if (FirmwareVersion[board] < 7) {
                // Rev 1-6 firmware: the last quadlet (Status/Control register)
                // is done as a separate quadlet write.
                BoardList[board]->GetWriteData(buf, 0, numQuads-1);
                bool noneWrittenThisBoard = true;
                bool ret = WriteBlock(board, 0, buf, numBytes-sizeof(quadlet_t));
                if (ret) { noneWritten = false; noneWrittenThisBoard = false; }
                else allOK = false;
                // Get last quadlet (false -> no byteswapping)
                quadlet_t ctrl;
                BoardList[board]->GetWriteData(&ctrl, numQuads-1, 1, false);
                bool ret2 = true;
                if (ctrl) {    // if anything non-zero, write it
                    ret2 = WriteQuadlet(board, 0, ctrl);
                    if (ret2) { noneWritten = false; noneWrittenThisBoard = false; }
                    else allOK = false;
                }
                if (noneWrittenThisBoard
                    || !(BoardList[board]->WriteBufferResetsWatchdog())) {
                    // send no-op to reset watchdog
                    bool ret3 = WriteNoOp(board);
                    if (ret3) noneWritten = false;
                }
                BoardList[board]->SetWriteValid(ret&&ret2);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
            }
            else {
                // Rev 7 firmware: write DAC (x4) and Status/Control register
                BoardList[board]->GetWriteData(buf, 0, numQuads);
                bool ret = WriteBlock(board, 0, buf, numBytes);
                BoardList[board]->SetWriteValid(ret);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
                if (ret) {
                    noneWritten = false;
                    // Check for data collection callback
                    BoardList[board]->CheckCollectCallback();
                }
                else {
                    allOK = false;
                }
            }
        }
    }
    if (noneWritten) {
        OnNoneWritten();
    }
    if (!rtWrite)
        outStr << "BasePort::WriteAllBoards: rtWrite is false" << std::endl;
    return allOK;
}